

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O0

void REVunstall_stone_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  CManager_conflict cm_00;
  CManager in_RDX;
  CMFormat f;
  EVunstall_stone_request *request;
  EV_void_response response;
  undefined4 in_stack_ffffffffffffffb8;
  EVstone in_stack_ffffffffffffffbc;
  CManager_conflict in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  
  cm_00 = (CManager_conflict)
          CMlookup_format(in_stack_ffffffffffffffc0,
                          (FMStructDescList)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (cm_00 == (CManager_conflict)0x0) {
    cm_00 = (CManager_conflict)INT_CMregister_format(in_RDX,(FMStructDescList)0x0);
  }
  EVunstall_stone(cm_00,in_stack_ffffffffffffffbc);
  CMwrite((CMConnection)CONCAT44(*(undefined4 *)&in_RDX->transports,in_stack_ffffffffffffffd0),
          (CMFormat)in_RDX,cm_00);
  return;
}

Assistant:

static void
REVunstall_stone_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_void_response response;
    EVunstall_stone_request *request = (EVunstall_stone_request *) data;
    CMFormat f = CMlookup_format(conn->cm, EV_void_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_void_response_formats);
    }
    EVunstall_stone(cm, request->stone_id);
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}